

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

_Bool askfor_aux_numbers(char *buf,size_t buflen,size_t *curs,size_t *len,keypress keypress,
                        _Bool firsttime)

{
  unkuint9 Var1;
  keypress keypress_00;
  _Bool firsttime_local;
  size_t *len_local;
  size_t *curs_local;
  size_t buflen_local;
  char *buf_local;
  keycode_t kStack_14;
  keypress keypress_local;
  
  kStack_14 = keypress.code;
  if ((((kStack_14 - 0x30 < 10) || (kStack_14 - 0x81 < 2)) || (kStack_14 == 0x9c)) ||
     ((kStack_14 - 0x9e < 2 || (kStack_14 == 0xe000)))) {
    Var1 = keypress._0_9_;
    keypress_00._9_3_ = 0;
    keypress_00.type = (int)Var1;
    keypress_00.code = (int)(Var1 >> 0x20);
    keypress_00.mods = (char)(Var1 >> 0x40);
    keypress_local.code._3_1_ = askfor_aux_keypress(buf,buflen,curs,len,keypress_00,firsttime);
  }
  else {
    keypress_local.code._3_1_ = false;
  }
  return keypress_local.code._3_1_;
}

Assistant:

static bool askfor_aux_numbers(char *buf, size_t buflen, size_t *curs, size_t *len, struct keypress keypress, bool firsttime)
{
	switch (keypress.code)
	{
		case ESCAPE:
		case KC_ENTER:
		case ARROW_LEFT:
		case ARROW_RIGHT:
		case KC_DELETE:
		case KC_BACKSPACE:
		case '0':
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9':
			return askfor_aux_keypress(buf, buflen, curs, len, keypress,
									   firsttime);
	}

	return false;
}